

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  char *pcVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar9;
  __sighandler_t p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar13;
  ulong uVar14;
  undefined8 uVar15;
  const_iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  Arguments args;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string filter_flag;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  long local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  long local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  int local_214;
  int local_210;
  int local_20c;
  string local_208;
  string local_1e8;
  char *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  string local_1a8;
  _union_1457 local_188;
  undefined1 auStack_180 [8];
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  ulong uStack_138;
  ulong local_130;
  ulong uStack_128;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  _union_1457 local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_20c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_214);
  if (iVar3 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    puVar9 = puVar7 + 2;
    local_318 = (ulong *)*puVar7;
    if (local_318 == puVar9) {
      local_308 = *puVar9;
      lStack_300 = puVar7[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar9;
    }
    local_310 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6;
    if (local_2d8 == paVar16) {
      local_2c8._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2c8._8_8_ = plVar6[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2d0 = plVar6[1];
    *plVar6 = (long)paVar16;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>(&local_298,(int *)&local_278);
    uVar15 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar15 = local_2c8._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_298._M_string_length + local_2d0) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar15 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_298._M_string_length + local_2d0) goto LAB_0013b285;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0013b285:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    local_2b8._M_dataplus._M_p = (pointer)*puVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == paVar16) {
      local_2b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2b8.field_2._8_8_ = puVar7[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2b8._M_string_length = puVar7[1];
    *puVar7 = paVar16;
    puVar7[1] = 0;
    paVar16->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    local_188.sa_handler = (__sighandler_t)*puVar7;
    if (local_188.sa_handler == p_Var10) {
      uStack_178 = *(ulong *)p_Var10;
      uStack_170 = puVar7[3];
      local_188.sa_handler = (__sighandler_t)&uStack_178;
    }
    else {
      uStack_178 = *(ulong *)p_Var10;
    }
    auStack_180 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    local_e8.sa_handler = (__sighandler_t)*puVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar11) {
      local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
      local_d8[0]._8_8_ = puVar7[3];
      local_e8.sa_handler = (__sighandler_t)local_d8;
    }
    else {
      local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
    }
    local_e0 = puVar7[1];
    *puVar7 = paVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    DeathTestAbort((string *)&local_e8);
    puVar7 = extraout_RAX_02;
    local_e8 = extraout_RDX_02;
LAB_0013bcc9:
    local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
  }
  else {
    iVar3 = fcntl(local_210,2,0);
    if (iVar3 != -1) {
      local_2f8 = &local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_318 = &local_308;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_308 = *puVar9;
        lStack_300 = plVar6[3];
      }
      else {
        local_308 = *puVar9;
        local_318 = (ulong *)*plVar6;
      }
      local_310 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = &local_2c8;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar16) {
        local_2c8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2c8._8_8_ = plVar6[3];
      }
      else {
        local_2c8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_2d0 = plVar6[1];
      *plVar6 = (long)paVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar16) {
        local_2b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_2b8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2b8._M_string_length = plVar6[1];
      *plVar6 = (long)paVar16;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_188.sa_handler = (__sighandler_t)&uStack_178;
      p_Var10 = (__sighandler_t)(plVar6 + 2);
      if ((__sighandler_t)*plVar6 == p_Var10) {
        uStack_178 = *(ulong *)p_Var10;
        uStack_170 = plVar6[3];
      }
      else {
        uStack_178 = *(ulong *)p_Var10;
        local_188.sa_handler = (__sighandler_t)*plVar6;
      }
      auStack_180 = (undefined1  [8])plVar6[1];
      *plVar6 = (long)p_Var10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar16) {
        local_d8[0]._0_8_ = paVar16->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar7[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar16->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar7;
      }
      local_e0 = puVar7[1];
      *puVar7 = paVar16;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar16 = &local_40;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_40._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_40._8_8_ = plVar6[3];
        local_50 = paVar16;
      }
      else {
        local_40._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
      }
      local_48 = plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_188.sa_handler != (__sighandler_t)&uStack_178) {
        operator_delete(local_188.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_258.field_2._M_allocated_capacity = *puVar9;
        local_258.field_2._8_8_ = plVar6[3];
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar9;
        local_258._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_298.field_2._M_allocated_capacity = *puVar9;
        local_298.field_2._8_8_ = plVar6[3];
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar9;
        local_298._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_298._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar11) {
        local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2e8._8_8_ = plVar6[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_2f0 = plVar6[1];
      *plVar6 = (long)paVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_318 = &local_308;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_308 = *puVar9;
        lStack_300 = plVar6[3];
      }
      else {
        local_308 = *puVar9;
        local_318 = (ulong *)*plVar6;
      }
      local_310 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>(&local_208,&this->line_);
      uVar14 = 0xf;
      if (local_318 != &local_308) {
        uVar14 = local_308;
      }
      if (uVar14 < local_208._M_string_length + local_310) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar15 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_208._M_string_length + local_310) goto LAB_00139e26;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_318);
      }
      else {
LAB_00139e26:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_318,(ulong)local_208._M_dataplus._M_p);
      }
      local_2d8 = &local_2c8;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar11) {
        local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2c8._8_8_ = puVar7[3];
      }
      else {
        local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
      }
      local_2d0 = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      paVar11->_M_local_buf[0] = '\0';
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar11) {
        local_2b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = puVar7[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2b8._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_2b8._M_string_length = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      StreamableToString<int>(&local_1e8,&local_20c);
      uVar14 = CONCAT44(local_1e8._M_string_length._4_4_,(int)local_1e8._M_string_length) +
               local_2b8._M_string_length;
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar15 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < uVar14) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          uVar15 = local_1e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < uVar14) goto LAB_00139f4f;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
      }
      else {
LAB_00139f4f:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_1e8._M_dataplus._M_p);
      }
      local_188.sa_handler = (__sighandler_t)&uStack_178;
      p_Var10 = (__sighandler_t)(puVar7 + 2);
      if ((__sighandler_t)*puVar7 == p_Var10) {
        uStack_178 = *(ulong *)p_Var10;
        uStack_170 = puVar7[3];
      }
      else {
        uStack_178 = *(ulong *)p_Var10;
        local_188.sa_handler = (__sighandler_t)*puVar7;
      }
      auStack_180 = (undefined1  [8])puVar7[1];
      *puVar7 = p_Var10;
      puVar7[1] = 0;
      *p_Var10 = (__sighandler_t)0x0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 == paVar11) {
        local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar7[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar7;
      }
      local_e0 = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      StreamableToString<int>(&local_1a8,&local_210);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        uVar15 = local_d8[0]._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_e0 + local_1a8._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a8._M_dataplus._M_p._4_4_,local_1a8._M_dataplus._M_p._0_4_) !=
            &local_1a8.field_2) {
          uVar15 = local_1a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_e0 + local_1a8._M_string_length) goto LAB_0013a099;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_0013a099:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_e8,
                            (ulong)CONCAT44(local_1a8._M_dataplus._M_p._4_4_,
                                            local_1a8._M_dataplus._M_p._0_4_));
      }
      local_1c8 = (char *)&local_1b8;
      pcVar1 = (char *)(puVar7 + 2);
      if ((char *)*puVar7 == pcVar1) {
        local_1b8 = *(undefined8 *)pcVar1;
        uStack_1b0 = puVar7[3];
      }
      else {
        local_1b8 = *(undefined8 *)pcVar1;
        local_1c8 = (char *)*puVar7;
      }
      local_1c0 = puVar7[1];
      *puVar7 = pcVar1;
      puVar7[1] = 0;
      *pcVar1 = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a8._M_dataplus._M_p._4_4_,local_1a8._M_dataplus._M_p._0_4_) !=
          &local_1a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a8._M_dataplus._M_p._4_4_,local_1a8._M_dataplus._M_p._0_4_))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_188.sa_handler != (__sighandler_t)&uStack_178) {
        operator_delete(local_188.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      Arguments::Arguments((Arguments *)&local_208);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e8,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
      __position._M_current = (char **)(local_208._M_string_length - 8);
      local_e8.sa_handler = (__sighandler_t)strdup(local_50->_M_local_buf);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,__position,
                 (value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)strdup(local_1c8);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,
                 (char **)(local_208._M_string_length - 8),(value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      uStack_108 = 0;
      uStack_100 = 0;
      uStack_f8 = 0;
      uStack_148 = 0;
      uStack_140 = 0;
      uStack_138 = 0;
      local_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      local_188.sa_handler = (__sighandler_t)0x0;
      auStack_180 = (undefined1  [8])0x0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      local_1e8._M_dataplus._M_p = local_208._M_dataplus._M_p;
      local_1e8._M_string_length._0_4_ = local_214;
      sigemptyset((sigset_t *)auStack_180);
      local_188 = (_union_1457)0x1;
      do {
        iVar3 = sigaction(0x1b,(sigaction *)&local_188,(sigaction *)&local_e8);
        if (iVar3 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar3 = fork();
            if (iVar3 == 0) {
              ExecDeathTestChildMain(&local_1e8);
              goto LAB_0013ab27;
            }
LAB_0013a4fb:
            goto LAB_0013a503;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_0013ab27:
            AssumeRole();
          }
          uVar4 = getpagesize();
          __len = (size_t)(int)uVar4;
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_278,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
            puVar9 = puVar7 + 2;
            local_298._M_dataplus._M_p = (pointer)*puVar7;
            if ((ulong *)local_298._M_dataplus._M_p == puVar9) {
              local_298.field_2._M_allocated_capacity = *puVar9;
              local_298.field_2._8_8_ = puVar7[3];
              local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            }
            else {
              local_298.field_2._M_allocated_capacity = *puVar9;
            }
            local_298._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
            local_2f8 = &local_2e8;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            if (paVar11 != paVar12) goto LAB_0013b5bb;
            local_2e8._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_2e8._8_8_ = puVar7[3];
            goto LAB_0013b5c8;
          }
          lVar13 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar13 = __len - 0x40;
          }
          if ((uVar4 < 0x41) || (((ulong)(lVar13 + (long)__addr) & 0x3f) != 0)) {
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_278,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
            puVar9 = puVar7 + 2;
            local_298._M_dataplus._M_p = (pointer)*puVar7;
            if ((ulong *)local_298._M_dataplus._M_p == puVar9) {
              local_298.field_2._M_allocated_capacity = *puVar9;
              local_298.field_2._8_8_ = puVar7[3];
              local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            }
            else {
              local_298.field_2._M_allocated_capacity = *puVar9;
            }
            local_298._M_string_length = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
            if (local_2f8 == paVar11) {
              local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2e8._8_8_ = puVar7[3];
              local_2f8 = &local_2e8;
            }
            else {
              local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_2f0 = puVar7[1];
            *puVar7 = paVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            local_238._M_dataplus._M_p._0_4_ = 0x569;
            StreamableToString<int>(&local_258,(int *)&local_238);
            uVar15 = 0xf;
            if (local_2f8 != &local_2e8) {
              uVar15 = local_2e8._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_258._M_string_length + local_2f0) {
              uVar15 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                uVar15 = local_258.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_0013b6fe;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
            }
            else {
LAB_0013b6fe:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
            }
            puVar9 = puVar7 + 2;
            local_318 = (ulong *)*puVar7;
            if (local_318 == puVar9) {
              local_308 = *puVar9;
              lStack_300 = puVar7[3];
              local_318 = &local_308;
            }
            else {
              local_308 = *puVar9;
            }
            local_310 = puVar7[1];
            *puVar7 = puVar9;
            puVar7[1] = 0;
            *(undefined1 *)puVar9 = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7;
            if (local_2d8 == paVar11) {
              local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_2c8._8_8_ = puVar7[3];
              local_2d8 = &local_2c8;
            }
            else {
              local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_2d0 = puVar7[1];
            *puVar7 = paVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar7 + 2);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            if (paVar11 != paVar12) goto LAB_0013be88;
            local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_2b8.field_2._8_8_ = puVar7[3];
            goto LAB_0013be95;
          }
          iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar13 + (long)__addr),0x11,&local_1e8);
          iVar5 = munmap(__addr,__len);
          if (iVar5 != -1) goto LAB_0013a4fb;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          puVar9 = puVar7 + 2;
          local_298._M_dataplus._M_p = (pointer)*puVar7;
          if ((ulong *)local_298._M_dataplus._M_p == puVar9) {
            local_298.field_2._M_allocated_capacity = *puVar9;
            local_298.field_2._8_8_ = puVar7[3];
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          }
          else {
            local_298.field_2._M_allocated_capacity = *puVar9;
          }
          local_298._M_string_length = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
          if (local_2f8 == paVar11) {
            local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2e8._8_8_ = puVar7[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_2f0 = puVar7[1];
          *puVar7 = paVar11;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          local_238._M_dataplus._M_p._0_4_ = 0x56d;
          StreamableToString<int>(&local_258,(int *)&local_238);
          uVar15 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar15 = local_2e8._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_258._M_string_length + local_2f0) {
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar15 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_0013b7a7;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_0013b7a7:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          puVar9 = puVar7 + 2;
          local_318 = (ulong *)*puVar7;
          if (local_318 == puVar9) {
            local_308 = *puVar9;
            lStack_300 = puVar7[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar9;
          }
          local_310 = puVar7[1];
          *puVar7 = puVar9;
          puVar7[1] = 0;
          *(undefined1 *)puVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
          if (local_2d8 == paVar11) {
            local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2c8._8_8_ = puVar7[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_2d0 = puVar7[1];
          *puVar7 = paVar11;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
          if (paVar11 != paVar12) goto LAB_0013beb6;
          local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_2b8.field_2._8_8_ = puVar7[3];
          goto LAB_0013bec3;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      puVar9 = puVar7 + 2;
      local_278._M_dataplus._M_p = (pointer)*puVar7;
      if ((ulong *)local_278._M_dataplus._M_p == puVar9) {
        local_278.field_2._M_allocated_capacity = *puVar9;
        local_278.field_2._8_8_ = puVar7[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar9;
      }
      local_278._M_string_length = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      puVar9 = puVar7 + 2;
      local_298._M_dataplus._M_p = (pointer)*puVar7;
      if ((ulong *)local_298._M_dataplus._M_p == puVar9) {
        local_298.field_2._M_allocated_capacity = *puVar9;
        local_298.field_2._8_8_ = puVar7[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar9;
      }
      local_298._M_string_length = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_1a8._M_dataplus._M_p._0_4_ = 0x54f;
      StreamableToString<int>(&local_238,(int *)&local_1a8);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar15 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_238._M_string_length + local_298._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar15 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_238._M_string_length + local_298._M_string_length)
        goto LAB_0013a878;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_238,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
      }
      else {
LAB_0013a878:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_298,(ulong)local_238._M_dataplus._M_p);
      }
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      if (local_2f8 == paVar11) {
        local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      paVar11->_M_local_buf[0] = '\0';
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
      puVar9 = puVar7 + 2;
      local_318 = (ulong *)*puVar7;
      if (local_318 == puVar9) {
        local_308 = *puVar9;
        lStack_300 = puVar7[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar9;
      }
      local_310 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      if (local_2d8 == paVar11) {
        local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2c8._8_8_ = puVar7[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2d0 = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      local_2b8._M_dataplus._M_p = (pointer)*puVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar12) {
        local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = puVar7[3];
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2b8._M_string_length = puVar7[1];
      *puVar7 = paVar12;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      DeathTestAbort(&local_2b8);
      puVar7 = extraout_RAX;
      paVar11 = extraout_RDX;
      goto LAB_0013b556;
    }
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    puVar9 = puVar7 + 2;
    local_318 = (ulong *)*puVar7;
    if (local_318 == puVar9) {
      local_308 = *puVar9;
      lStack_300 = puVar7[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar9;
    }
    local_310 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7;
    if (local_2d8 == paVar16) {
      local_2c8._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2c8._8_8_ = puVar7[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2d0 = puVar7[1];
    *puVar7 = paVar16;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>(&local_298,(int *)&local_278);
    uVar15 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar15 = local_2c8._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_298._M_string_length + local_2d0) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar15 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_298._M_string_length + local_2d0) goto LAB_0013b329;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0013b329:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    local_2b8._M_dataplus._M_p = (pointer)*puVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == paVar16) {
      local_2b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_2b8.field_2._8_8_ = puVar7[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_2b8._M_string_length = puVar7[1];
    *puVar7 = paVar16;
    puVar7[1] = 0;
    paVar16->_M_local_buf[0] = '\0';
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    local_188.sa_handler = (__sighandler_t)*puVar7;
    if (local_188.sa_handler == p_Var10) {
      uStack_178 = *(ulong *)p_Var10;
      uStack_170 = puVar7[3];
      local_188.sa_handler = (__sighandler_t)&uStack_178;
    }
    else {
      uStack_178 = *(ulong *)p_Var10;
    }
    auStack_180 = (undefined1  [8])puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar7 + 2);
    local_e8.sa_handler = (__sighandler_t)*puVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler != paVar11) goto LAB_0013bcc9;
    local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_d8[0]._8_8_ = puVar7[3];
    local_e8.sa_handler = (__sighandler_t)local_d8;
  }
  paVar16 = &local_2c8;
  local_e0 = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar7 = extraout_RAX_03;
  local_2d8 = extraout_RDX_03;
  goto LAB_0013bd00;
LAB_0013a59c:
  do {
    iVar5 = close(local_210);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_214;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_208);
      if (local_1c8 != (char *)&local_1b8) {
        operator_delete(local_1c8);
      }
      if (local_50 != paVar16) {
        operator_delete(local_50);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  if (local_2f8 == paVar11) {
    local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2e8._8_8_ = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2f0 = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = puVar7 + 2;
  local_318 = (ulong *)*puVar7;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_258._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_278,(int *)&local_258);
  uVar14 = 0xf;
  if (local_318 != &local_308) {
    uVar14 = local_308;
  }
  if (uVar14 < local_278._M_string_length + local_310) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar15 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_278._M_string_length + local_310) goto LAB_0013a9e3;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_0013a9e3:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_278._M_dataplus._M_p);
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  if (local_2d8 == paVar11) {
    local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2c8._8_8_ = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2d0 = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  paVar11->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2b8._M_dataplus._M_p = (pointer)*puVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p == paVar11) {
    local_2b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = puVar7[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2b8._M_string_length = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  local_188.sa_handler = (__sighandler_t)*plVar6;
  if (local_188.sa_handler == p_Var10) {
    uStack_178 = *(ulong *)p_Var10;
    uStack_170 = plVar6[3];
    local_188.sa_handler = (__sighandler_t)&uStack_178;
  }
  else {
    uStack_178 = *(ulong *)p_Var10;
  }
  auStack_180 = (undefined1  [8])plVar6[1];
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_e8.sa_handler = (__sighandler_t)*puVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.sa_handler != paVar12) goto LAB_0013b584;
  local_d8[0]._0_8_ = paVar12->_M_allocated_capacity;
  local_d8[0]._8_8_ = puVar7[3];
  local_e8.sa_handler = (__sighandler_t)local_d8;
  goto LAB_0013b597;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_0013a503:
    iVar5 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar3 != -1) goto LAB_0013a59c;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","")
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      puVar9 = puVar7 + 2;
      local_298._M_dataplus._M_p = (pointer)*puVar7;
      if ((ulong *)local_298._M_dataplus._M_p == puVar9) {
        local_298.field_2._M_allocated_capacity = *puVar9;
        local_298.field_2._8_8_ = puVar7[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar9;
      }
      local_298._M_string_length = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      if (local_2f8 == paVar11) {
        local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2e8._8_8_ = puVar7[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2f0 = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      local_238._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_258,(int *)&local_238);
      uVar15 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar15 = local_2e8._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_258._M_string_length + local_2f0) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar15 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_0013b519;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_0013b519:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
      }
      puVar9 = puVar7 + 2;
      local_318 = (ulong *)*puVar7;
      if (local_318 == puVar9) {
        local_308 = *puVar9;
        lStack_300 = puVar7[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar9;
      }
      local_310 = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar7 + 2);
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7;
      if (local_2d8 == paVar11) {
        local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2c8._8_8_ = puVar7[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2d0 = puVar7[1];
      *puVar7 = paVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      local_2b8._M_dataplus._M_p = (pointer)*plVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar12) {
        local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = plVar6[3];
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_2b8._M_string_length = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2b8);
      puVar7 = extraout_RAX_04;
      local_2b8._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0013be5a;
    }
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  puVar9 = puVar7 + 2;
  local_278._M_dataplus._M_p = (pointer)*puVar7;
  if ((ulong *)local_278._M_dataplus._M_p == puVar9) {
    local_278.field_2._M_allocated_capacity = *puVar9;
    local_278.field_2._8_8_ = puVar7[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar9;
  }
  local_278._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  puVar9 = puVar7 + 2;
  local_298._M_dataplus._M_p = (pointer)*puVar7;
  if ((ulong *)local_298._M_dataplus._M_p == puVar9) {
    local_298.field_2._M_allocated_capacity = *puVar9;
    local_298.field_2._8_8_ = puVar7[3];
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *puVar9;
  }
  local_298._M_string_length = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_1a8._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_238,(int *)&local_1a8);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    uVar15 = local_298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_238._M_string_length + local_298._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      uVar15 = local_238.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_238._M_string_length + local_298._M_string_length) goto LAB_0013a939;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_238,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
  }
  else {
LAB_0013a939:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_238._M_dataplus._M_p);
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  if (local_2f8 == paVar11) {
    local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2e8._8_8_ = puVar7[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2f0 = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  paVar11->_M_local_buf[0] = '\0';
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = puVar7 + 2;
  local_318 = (ulong *)*puVar7;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  if (local_2d8 == paVar11) {
    local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2c8._8_8_ = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2d0 = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7;
  if (paVar11 == paVar12) {
    local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = puVar7[3];
  }
  else {
LAB_0013b556:
    local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b8._M_dataplus._M_p = (pointer)paVar11;
  }
  local_2b8._M_string_length = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b8);
  puVar7 = extraout_RAX_00;
  local_e8 = extraout_RDX_00;
LAB_0013b584:
  local_d8[0]._0_8_ = paVar12->_M_allocated_capacity;
LAB_0013b597:
  local_e0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar7 = extraout_RAX_01;
  paVar11 = extraout_RDX_01;
LAB_0013b5bb:
  local_2e8._M_allocated_capacity = paVar12->_M_allocated_capacity;
  local_2f8 = paVar11;
LAB_0013b5c8:
  local_2f0 = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_238._M_dataplus._M_p._0_4_ = 0x55b;
  StreamableToString<int>(&local_258,(int *)&local_238);
  uVar15 = 0xf;
  if (local_2f8 != &local_2e8) {
    uVar15 = local_2e8._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_258._M_string_length + local_2f0) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      uVar15 = local_258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_258._M_string_length + local_2f0) goto LAB_0013b655;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
  }
  else {
LAB_0013b655:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
  }
  puVar9 = puVar7 + 2;
  local_318 = (ulong *)*puVar7;
  if (local_318 == puVar9) {
    local_308 = *puVar9;
    lStack_300 = puVar7[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar9;
  }
  local_310 = puVar7[1];
  *puVar7 = puVar9;
  puVar7[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7;
  if (local_2d8 == paVar11) {
    local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2c8._8_8_ = puVar7[3];
    local_2d8 = &local_2c8;
  }
  else {
LAB_0013bd00:
    local_2c8._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2d0 = puVar7[1];
  *puVar7 = paVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar7 + 2);
  local_2b8._M_dataplus._M_p = (pointer)*puVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p == paVar12) {
    local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = puVar7[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
LAB_0013be5a:
    local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_2b8._M_string_length = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b8);
  puVar7 = extraout_RAX_05;
  paVar11 = extraout_RDX_05;
LAB_0013be88:
  local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  local_2b8._M_dataplus._M_p = (pointer)paVar11;
LAB_0013be95:
  local_2b8._M_string_length = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b8);
  puVar7 = extraout_RAX_06;
  paVar11 = extraout_RDX_06;
LAB_0013beb6:
  local_2b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
  local_2b8._M_dataplus._M_p = (pointer)paVar11;
LAB_0013bec3:
  local_2b8._M_string_length = puVar7[1];
  *puVar7 = paVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  Arguments::~Arguments((Arguments *)&local_208);
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_50 != paVar16) {
    operator_delete(local_50);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}